

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O0

TableData ma_table_lookup(Integer handle)

{
  Boolean BVar1;
  char *in_RDI;
  Integer in_stack_fffffffffffffff8;
  TableData pcVar2;
  
  BVar1 = ma_table_verify(in_stack_fffffffffffffff8,in_RDI);
  if (BVar1 == 0) {
    pcVar2 = (TableData)0x0;
  }
  else {
    pcVar2 = ma_table[(long)in_RDI].data;
  }
  return pcVar2;
}

Assistant:

public TableData ma_table_lookup(handle)
    Integer    handle;        /* to lookup */
{
    if (ma_table_verify(handle, "ma_table_lookup"))
        /* success */
        return ma_table[handle].data;
    else
        /* failure */
        return (TableData)NULL;
}